

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::RandomFragmentOpTests::init(RandomFragmentOpTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  RandomFragmentOpCase *this_00;
  int local_54;
  string local_50;
  
  for (local_54 = 0; local_54 < 100; local_54 = local_54 + 1) {
    this_00 = (RandomFragmentOpCase *)operator_new(200);
    context = (this->super_TestCaseGroup).m_context;
    de::toString<int>(&local_50,&local_54);
    RandomFragmentOpCase::RandomFragmentOpCase
              (this_00,context,local_50._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
               local_54 * 10);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return local_54;
}

Assistant:

void RandomFragmentOpTests::init (void)
{
	for (int ndx = 0; ndx < 100; ndx++)
		addChild(new RandomFragmentOpCase(m_context, de::toString(ndx).c_str(), "", (deUint32)(ndx*NUM_ITERATIONS_PER_CASE)));
}